

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

RandSeqProductionSymbol *
slang::ast::RandSeqProductionSymbol::fromSyntax(Scope *scope,ProductionSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *args_00;
  RsRuleSyntax *syntax_00;
  SyntaxNode *syntax_01;
  int iVar2;
  RandSeqProductionSymbol *pRVar3;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  StatementBlockSymbol *member;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  long lVar5;
  ulong uVar6;
  Scope *this;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> args;
  SourceLocation local_78;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_70 [2];
  
  args_00 = scope->compilation;
  local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_78 = parsing::Token::location(&syntax->name);
  pRVar3 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args_00->super_BumpAllocator,args_00,
                      (basic_string_view<char,_std::char_traits<char>_> *)local_70,&local_78);
  (pRVar3->super_Symbol).originatingSyntax = &syntax->super_SyntaxNode;
  if (syntax->dataType == (DataTypeSyntax *)0x0) {
    (pRVar3->declaredReturnType).type = args_00->voidType;
  }
  else {
    (pRVar3->declaredReturnType).typeOrLink.typeSyntax = syntax->dataType;
    puVar1 = &(pRVar3->declaredReturnType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
  }
  if (syntax->portList != (FunctionPortListSyntax *)0x0) {
    local_70[0].len = 0;
    local_70[0].data_ = (pointer)((long)local_70 + 0x18U);
    local_70[0].cap = 5;
    SubroutineSymbol::buildArguments(&pRVar3->super_Scope,scope,syntax->portList,Automatic,local_70)
    ;
    iVar2 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_70,(EVP_PKEY_CTX *)args_00,src);
    (pRVar3->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    (pRVar3->arguments)._M_extent._M_extent_value = extraout_RDX;
    if (local_70[0].data_ != (pointer)((long)local_70 + 0x18U)) {
      operator_delete(local_70[0].data_);
    }
  }
  uVar6 = (syntax->rules).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    this = &pRVar3->super_Scope;
    lVar5 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->rules).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      syntax_00 = (RsRuleSyntax *)*ppSVar4;
      syntax_01 = (syntax_00->super_SyntaxNode).previewNode;
      if (syntax_01 != (SyntaxNode *)0x0) {
        Scope::addMembers(this,syntax_01);
      }
      member = StatementBlockSymbol::fromSyntax(this,syntax_00);
      Scope::insertMember(this,&member->super_Symbol,(pRVar3->super_Scope).lastMember,false,true);
      lVar5 = lVar5 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return pRVar3;
}

Assistant:

RandSeqProductionSymbol& RandSeqProductionSymbol::fromSyntax(const Scope& scope,
                                                             const ProductionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<RandSeqProductionSymbol>(comp, syntax.name.valueText(),
                                                        syntax.name.location());
    result->setSyntax(syntax);

    if (syntax.dataType)
        result->declaredReturnType.setTypeSyntax(*syntax.dataType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    if (syntax.portList) {
        SmallVector<const FormalArgumentSymbol*> args;
        SubroutineSymbol::buildArguments(*result, scope, *syntax.portList,
                                         VariableLifetime::Automatic, args);
        result->arguments = args.copy(comp);
    }

    for (auto rule : syntax.rules) {
        if (rule->previewNode)
            result->addMembers(*rule->previewNode);

        auto& ruleBlock = StatementBlockSymbol::fromSyntax(*result, *rule);
        result->addMember(ruleBlock);
    }

    return *result;
}